

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int getPageNormal(Pager *pPager,Pgno pgno,DbPage **ppPage,int flags)

{
  int iVar1;
  sqlite3_pcache_page *local_48;
  sqlite3_pcache_page *pBase;
  PgHdr *pPStack_38;
  u8 noContent;
  PgHdr *pPg;
  int rc;
  int flags_local;
  DbPage **ppPage_local;
  Pager *pPStack_18;
  Pgno pgno_local;
  Pager *pPager_local;
  
  pPg._0_4_ = 0;
  pPg._4_4_ = flags;
  _rc = ppPage;
  ppPage_local._4_4_ = pgno;
  pPStack_18 = pPager;
  if (pgno == 0) {
    iVar1 = sqlite3CorruptError(0xdafa);
    return iVar1;
  }
  local_48 = sqlite3PcacheFetch(pPager->pPCache,pgno,3);
  if (local_48 == (sqlite3_pcache_page *)0x0) {
    pPStack_38 = (PgHdr *)0x0;
    pPg._0_4_ = sqlite3PcacheFetchStress(pPStack_18->pPCache,ppPage_local._4_4_,&local_48);
    if ((int)pPg != 0) goto LAB_0016eb30;
    if (local_48 == (sqlite3_pcache_page *)0x0) {
      pPg._0_4_ = 7;
      goto LAB_0016eb30;
    }
    pPg._0_4_ = 0;
  }
  pPStack_38 = sqlite3PcacheFetchFinish(pPStack_18->pPCache,ppPage_local._4_4_,local_48);
  *_rc = pPStack_38;
  pBase._7_1_ = (pPg._4_4_ & 1) != 0;
  if ((pPStack_38->pPager != (Pager *)0x0) && (!(bool)pBase._7_1_)) {
    pPStack_18->aStat[0] = pPStack_18->aStat[0] + 1;
    return 0;
  }
  if ((ppPage_local._4_4_ < 0x80000000) &&
     (ppPage_local._4_4_ != sqlite3PendingByte / pPStack_18->pageSize + 1U)) {
    pPStack_38->pPager = pPStack_18;
    if (((pPStack_18->fd->pMethods == (sqlite3_io_methods *)0x0) ||
        (pPStack_18->dbSize < ppPage_local._4_4_)) || ((bool)pBase._7_1_)) {
      if (ppPage_local._4_4_ <= pPStack_18->mxPgno) {
        if ((bool)pBase._7_1_) {
          sqlite3BeginBenignMalloc();
          if (ppPage_local._4_4_ <= pPStack_18->dbOrigSize) {
            sqlite3BitvecSet(pPStack_18->pInJournal,ppPage_local._4_4_);
          }
          addToSavepointBitvecs(pPStack_18,ppPage_local._4_4_);
          sqlite3EndBenignMalloc();
        }
        memset(pPStack_38->pData,0,(long)pPStack_18->pageSize);
        return 0;
      }
      pPg._0_4_ = 0xd;
    }
    else {
      pPStack_18->aStat[1] = pPStack_18->aStat[1] + 1;
      pPg._0_4_ = readDbPage(pPStack_38);
      if ((int)pPg == 0) {
        return 0;
      }
    }
  }
  else {
    pPg._0_4_ = sqlite3CorruptError(0xdb1a);
  }
LAB_0016eb30:
  if (pPStack_38 != (PgHdr *)0x0) {
    sqlite3PcacheDrop(pPStack_38);
  }
  pagerUnlockIfUnused(pPStack_18);
  *_rc = (DbPage *)0x0;
  return (int)pPg;
}

Assistant:

static int getPageNormal(
  Pager *pPager,      /* The pager open on the database file */
  Pgno pgno,          /* Page number to fetch */
  DbPage **ppPage,    /* Write a pointer to the page here */
  int flags           /* PAGER_GET_XXX flags */
){
  int rc = SQLITE_OK;
  PgHdr *pPg;
  u8 noContent;                   /* True if PAGER_GET_NOCONTENT is set */
  sqlite3_pcache_page *pBase;

  assert( pPager->errCode==SQLITE_OK );
  assert( pPager->eState>=PAGER_READER );
  assert( assert_pager_state(pPager) );
  assert( pPager->hasHeldSharedLock==1 );

  if( pgno==0 ) return SQLITE_CORRUPT_BKPT;
  pBase = sqlite3PcacheFetch(pPager->pPCache, pgno, 3);
  if( pBase==0 ){
    pPg = 0;
    rc = sqlite3PcacheFetchStress(pPager->pPCache, pgno, &pBase);
    if( rc!=SQLITE_OK ) goto pager_acquire_err;
    if( pBase==0 ){
      rc = SQLITE_NOMEM_BKPT;
      goto pager_acquire_err;
    }
  }
  pPg = *ppPage = sqlite3PcacheFetchFinish(pPager->pPCache, pgno, pBase);
  assert( pPg==(*ppPage) );
  assert( pPg->pgno==pgno );
  assert( pPg->pPager==pPager || pPg->pPager==0 );

  noContent = (flags & PAGER_GET_NOCONTENT)!=0;
  if( pPg->pPager && !noContent ){
    /* In this case the pcache already contains an initialized copy of
    ** the page. Return without further ado.  */
    assert( pgno<=PAGER_MAX_PGNO && pgno!=PAGER_MJ_PGNO(pPager) );
    pPager->aStat[PAGER_STAT_HIT]++;
    return SQLITE_OK;

  }else{
    /* The pager cache has created a new page. Its content needs to 
    ** be initialized. But first some error checks:
    **
    ** (1) The maximum page number is 2^31
    ** (2) Never try to fetch the locking page
    */
    if( pgno>PAGER_MAX_PGNO || pgno==PAGER_MJ_PGNO(pPager) ){
      rc = SQLITE_CORRUPT_BKPT;
      goto pager_acquire_err;
    }

    pPg->pPager = pPager;

    assert( !isOpen(pPager->fd) || !MEMDB );
    if( !isOpen(pPager->fd) || pPager->dbSize<pgno || noContent ){
      if( pgno>pPager->mxPgno ){
        rc = SQLITE_FULL;
        goto pager_acquire_err;
      }
      if( noContent ){
        /* Failure to set the bits in the InJournal bit-vectors is benign.
        ** It merely means that we might do some extra work to journal a 
        ** page that does not need to be journaled.  Nevertheless, be sure 
        ** to test the case where a malloc error occurs while trying to set 
        ** a bit in a bit vector.
        */
        sqlite3BeginBenignMalloc();
        if( pgno<=pPager->dbOrigSize ){
          TESTONLY( rc = ) sqlite3BitvecSet(pPager->pInJournal, pgno);
          testcase( rc==SQLITE_NOMEM );
        }
        TESTONLY( rc = ) addToSavepointBitvecs(pPager, pgno);
        testcase( rc==SQLITE_NOMEM );
        sqlite3EndBenignMalloc();
      }
      memset(pPg->pData, 0, pPager->pageSize);
      IOTRACE(("ZERO %p %d\n", pPager, pgno));
    }else{
      assert( pPg->pPager==pPager );
      pPager->aStat[PAGER_STAT_MISS]++;
      rc = readDbPage(pPg);
      if( rc!=SQLITE_OK ){
        goto pager_acquire_err;
      }
    }
    pager_set_pagehash(pPg);
  }
  return SQLITE_OK;

pager_acquire_err:
  assert( rc!=SQLITE_OK );
  if( pPg ){
    sqlite3PcacheDrop(pPg);
  }
  pagerUnlockIfUnused(pPager);
  *ppPage = 0;
  return rc;
}